

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

Vector getNormalVector(Triangle *triangle)

{
  Point *pPVar1;
  Point PVar2;
  Vector VVar3;
  Vector local_c0;
  Vector local_b0;
  Point local_a0;
  undefined8 local_90;
  float local_88;
  undefined8 local_80;
  float local_78;
  undefined1 local_70 [8];
  Vector v0v2;
  float fStack_5c;
  float local_58;
  undefined1 local_30 [8];
  Vector v0v1;
  Triangle *triangle_local;
  
  unique0x10000128 = triangle;
  PVar2 = operator-(triangle->y,&triangle->x);
  local_58 = PVar2.z;
  v0v1.x = local_58;
  stack0xffffffffffffffa0 = PVar2._0_8_;
  local_30._0_4_ = v0v2.z;
  local_30._4_4_ = fStack_5c;
  local_88 = (stack0xffffffffffffffe0->z).z;
  pPVar1 = &stack0xffffffffffffffe0->z;
  local_90._0_4_ = pPVar1->x;
  local_90._4_4_ = pPVar1->y;
  local_80 = local_90;
  local_78 = local_88;
  unique0x1000011c = PVar2;
  PVar2 = operator-(*pPVar1,&stack0xffffffffffffffe0->x);
  local_a0.z = PVar2.z;
  v0v2.x = local_a0.z;
  local_a0._0_8_ = PVar2._0_8_;
  local_70._0_4_ = local_a0.x;
  local_70._4_4_ = local_a0.y;
  local_a0 = PVar2;
  VVar3 = crossProduct((Vector *)local_30,(Vector *)local_70);
  local_c0.z = VVar3.z;
  local_b0.z = local_c0.z;
  local_c0._0_8_ = VVar3._0_8_;
  local_b0.x = local_c0.x;
  local_b0.y = local_c0.y;
  VVar3 = normalize(&local_b0);
  return VVar3;
}

Assistant:

Vector getNormalVector(Triangle const& triangle)
{
  Vector v0v1 = triangle.y - triangle.x;
  Vector v0v2 = triangle.z - triangle.x;
  return normalize(crossProduct(v0v1, v0v2));
}